

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat * __thiscall Mat::operator+(Mat *__return_storage_ptr__,Mat *this,Mat *a)

{
  ulong *puVar1;
  pointer p_Var2;
  pointer p_Var3;
  pointer p_Var4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  Mat(__return_storage_ptr__,this->r,this->c);
  uVar6 = this->c * this->r;
  p_Var2 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var3 = (a->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var4 = (__return_storage_ptr__->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar7 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar7 = uVar10;
  }
  for (; uVar7 * 0x10 != uVar10; uVar10 = uVar10 + 0x10) {
    uVar9 = *(ulong *)((long)p_Var3 + uVar10);
    puVar1 = (ulong *)((long)p_Var2 + uVar10);
    uVar11 = uVar9 + *puVar1;
    lVar8 = *(long *)((long)p_Var3 + uVar10 + 8) + *(long *)((long)p_Var2 + uVar10 + 8) +
            (ulong)CARRY8(uVar9,*puVar1);
    uVar9 = uVar11 + 0x16345785d8a0003;
    lVar5 = lVar8 + (ulong)(0xfe9cba87a275fffc < uVar11);
    if ((SBORROW8(lVar8,-1) != SBORROW8(lVar8 + 1,(ulong)(uVar11 < 0xfe9cba87a275fffe))) ==
        (long)((lVar8 + 1) - (ulong)(uVar11 < 0xfe9cba87a275fffe)) < 0) {
      uVar9 = uVar11;
      lVar5 = lVar8;
    }
    if (-lVar8 < (long)(ulong)(0x16345785d8a0002 < uVar11)) {
      uVar9 = uVar11 + 0xfe9cba87a275fffd;
      lVar5 = lVar8 + -1 + (ulong)(0x16345785d8a0002 < uVar11);
    }
    *(ulong *)((long)p_Var4 + uVar10) = uVar9;
    *(long *)((long)p_Var4 + uVar10 + 8) = lVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::operator+(const Mat &a) {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = val[i] + a.val[i];
        ret.val[i] = ret.val[i] >= MOD ? ret.val[i] - MOD : ret.val[i];
        ret.val[i] = ret.val[i] <= -MOD ? ret.val[i] + MOD : ret.val[i];
    }
    return ret;
}